

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O2

mbedtls_mpi_uint
mbedtls_mpi_core_add_if(mbedtls_mpi_uint *X,mbedtls_mpi_uint *A,size_t limbs,uint cond)

{
  ulong uVar1;
  ulong uVar2;
  mbedtls_mpi_uint mVar3;
  size_t i;
  size_t sVar4;
  ulong uVar5;
  
  uVar2 = cond ^ mbedtls_ct_zero;
  mVar3 = 0;
  for (sVar4 = 0; limbs != sVar4; sVar4 = sVar4 + 1) {
    uVar5 = A[sVar4] & (long)(-(uVar2 >> 1) | -uVar2) >> 0x3f;
    uVar1 = mVar3 + X[sVar4];
    mVar3 = (ulong)CARRY8(uVar5,uVar1) + (ulong)CARRY8(mVar3,X[sVar4]);
    X[sVar4] = uVar5 + uVar1;
  }
  return mVar3;
}

Assistant:

mbedtls_mpi_uint mbedtls_mpi_core_add_if(mbedtls_mpi_uint *X,
                                         const mbedtls_mpi_uint *A,
                                         size_t limbs,
                                         unsigned cond)
{
    mbedtls_mpi_uint c = 0;

    mbedtls_ct_condition_t do_add = mbedtls_ct_bool(cond);

    for (size_t i = 0; i < limbs; i++) {
        mbedtls_mpi_uint add = mbedtls_ct_mpi_uint_if_else_0(do_add, A[i]);
        mbedtls_mpi_uint t = c + X[i];
        c = (t < X[i]);
        t += add;
        c += (t < add);
        X[i] = t;
    }

    return c;
}